

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O0

Maybe<char> __thiscall rc::Seq<char>::next(Seq<char> *this)

{
  bool bVar1;
  pointer pIVar2;
  unique_ptr *in_RSI;
  Seq<char> *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    pIVar2 = std::unique_ptr<rc::Seq<char>::ISeqImpl,_std::default_delete<rc::Seq<char>::ISeqImpl>_>
             ::operator->((unique_ptr<rc::Seq<char>::ISeqImpl,_std::default_delete<rc::Seq<char>::ISeqImpl>_>
                           *)in_RSI);
    (**pIVar2->_vptr_ISeqImpl)(this);
  }
  else {
    Maybe<char>::Maybe((Maybe<char> *)this);
  }
  return SUB82(this,0);
}

Assistant:

Maybe<T> Seq<T>::next() noexcept {
  try {
    return m_impl ? m_impl->next() : Nothing;
  } catch (...) {
    m_impl.reset();
    return Nothing;
  }
}